

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ARMDisassembler.c
# Opt level: O0

DecodeStatus DecodeThumb2BCCInstruction(MCInst *Inst,uint Insn,uint64_t Address,void *Decoder)

{
  _Bool _Var1;
  uint32_t uVar2;
  uint32_t uVar3;
  uint32_t uVar4;
  uint32_t uVar5;
  uint32_t uVar6;
  uint32_t uVar7;
  DecodeStatus DVar8;
  uint opc;
  uint imm;
  uint pred;
  uint brtarget;
  DecodeStatus S;
  void *Decoder_local;
  uint64_t Address_local;
  MCInst *pMStack_18;
  uint Insn_local;
  MCInst *Inst_local;
  
  pred = 3;
  _brtarget = Decoder;
  Decoder_local = (void *)Address;
  Address_local._4_4_ = Insn;
  pMStack_18 = Inst;
  uVar2 = fieldFromInstruction_4(Insn,0x16,4);
  if ((uVar2 == 0xe) || (uVar2 == 0xf)) {
    uVar2 = fieldFromInstruction_4(Address_local._4_4_,4,0x1c);
    if (uVar2 == 0xf3bf8f4) {
      MCInst_setOpcode(pMStack_18,0x91d);
    }
    else if (uVar2 == 0xf3bf8f5) {
      MCInst_setOpcode(pMStack_18,0x91c);
    }
    else {
      if (uVar2 != 0xf3bf8f6) {
        return MCDisassembler_Fail;
      }
      MCInst_setOpcode(pMStack_18,0x922);
    }
    uVar2 = fieldFromInstruction_4(Address_local._4_4_,0,4);
    Inst_local._4_4_ = DecodeMemBarrierOption(pMStack_18,uVar2,(uint64_t)Decoder_local,_brtarget);
  }
  else {
    uVar3 = fieldFromInstruction_4(Address_local._4_4_,0,0xb);
    uVar4 = fieldFromInstruction_4(Address_local._4_4_,0xb,1);
    uVar5 = fieldFromInstruction_4(Address_local._4_4_,0xd,1);
    uVar6 = fieldFromInstruction_4(Address_local._4_4_,0x10,6);
    uVar7 = fieldFromInstruction_4(Address_local._4_4_,0x1a,1);
    DVar8 = DecodeT2BROperand(pMStack_18,
                              uVar7 << 0x14 |
                              uVar6 << 0xc | uVar5 << 0x12 | uVar4 << 0x13 | uVar3 << 1,
                              (uint64_t)Decoder_local,_brtarget);
    _Var1 = Check(&pred,DVar8);
    if (_Var1) {
      DVar8 = DecodePredicateOperand(pMStack_18,uVar2,(uint64_t)Decoder_local,_brtarget);
      _Var1 = Check(&pred,DVar8);
      if (_Var1) {
        Inst_local._4_4_ = pred;
      }
      else {
        Inst_local._4_4_ = MCDisassembler_Fail;
      }
    }
    else {
      Inst_local._4_4_ = MCDisassembler_Fail;
    }
  }
  return Inst_local._4_4_;
}

Assistant:

static DecodeStatus DecodeThumb2BCCInstruction(MCInst *Inst, unsigned Insn,
		uint64_t Address, const void *Decoder)
{
	DecodeStatus S = MCDisassembler_Success;
	unsigned brtarget;
	unsigned pred = fieldFromInstruction_4(Insn, 22, 4);
	if (pred == 0xE || pred == 0xF) {
		unsigned imm;
		unsigned opc = fieldFromInstruction_4(Insn, 4, 28);
		switch (opc) {
			default:
				return MCDisassembler_Fail;
			case 0xf3bf8f4:
				MCInst_setOpcode(Inst, ARM_t2DSB);
				break;
			case 0xf3bf8f5:
				MCInst_setOpcode(Inst, ARM_t2DMB);
				break;
			case 0xf3bf8f6:
				MCInst_setOpcode(Inst, ARM_t2ISB);
				break;
		}

		imm = fieldFromInstruction_4(Insn, 0, 4);
		return DecodeMemBarrierOption(Inst, imm, Address, Decoder);
	}

	brtarget = fieldFromInstruction_4(Insn, 0, 11) << 1;
	brtarget |= fieldFromInstruction_4(Insn, 11, 1) << 19;
	brtarget |= fieldFromInstruction_4(Insn, 13, 1) << 18;
	brtarget |= fieldFromInstruction_4(Insn, 16, 6) << 12;
	brtarget |= fieldFromInstruction_4(Insn, 26, 1) << 20;

	if (!Check(&S, DecodeT2BROperand(Inst, brtarget, Address, Decoder)))
		return MCDisassembler_Fail;
	if (!Check(&S, DecodePredicateOperand(Inst, pred, Address, Decoder)))
		return MCDisassembler_Fail;

	return S;
}